

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

IEEEFloat * __thiscall llvm::detail::IEEEFloat::operator=(IEEEFloat *this,IEEEFloat *rhs)

{
  if (this != rhs) {
    if (this->semantics != rhs->semantics) {
      freeSignificand(this);
      initialize(this,rhs->semantics);
    }
    assign(this,rhs);
  }
  return this;
}

Assistant:

IEEEFloat &IEEEFloat::operator=(const IEEEFloat &rhs) {
  if (this != &rhs) {
    if (semantics != rhs.semantics) {
      freeSignificand();
      initialize(rhs.semantics);
    }
    assign(rhs);
  }

  return *this;
}